

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

btWheelInfo * __thiscall
btRaycastVehicle::addWheel
          (btRaycastVehicle *this,btVector3 *connectionPointCS,btVector3 *wheelDirectionCS0,
          btVector3 *wheelAxleCS,btScalar suspensionRestLength,btScalar wheelRadius,
          btVehicleTuning *tuning,bool isFrontWheel)

{
  int iVar1;
  btWheelInfo *pbVar2;
  btAlignedObjectArray<btWheelInfo> *in_RDI;
  btWheelInfo *wheel;
  bool in_stack_00000053;
  int in_stack_00000054;
  btRaycastVehicle *in_stack_00000058;
  btWheelInfoConstructionInfo ci;
  btWheelInfoConstructionInfo *in_stack_fffffffffffffe28;
  btWheelInfoConstructionInfo *in_stack_fffffffffffffe30;
  btWheelInfo *in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffea7;
  btWheelInfo *in_stack_fffffffffffffea8;
  btRaycastVehicle *in_stack_fffffffffffffeb0;
  
  btWheelInfoConstructionInfo::btWheelInfoConstructionInfo(in_stack_fffffffffffffe30);
  btWheelInfo::btWheelInfo((btWheelInfo *)(in_RDI + 6),in_stack_fffffffffffffe28);
  btAlignedObjectArray<btWheelInfo>::push_back(in_RDI,in_stack_fffffffffffffe38);
  in_RDI = in_RDI + 6;
  iVar1 = getNumWheels((btRaycastVehicle *)0x233a85);
  pbVar2 = btAlignedObjectArray<btWheelInfo>::operator[](in_RDI,iVar1 + -1);
  updateWheelTransformsWS
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(bool)in_stack_fffffffffffffea7);
  getNumWheels((btRaycastVehicle *)0x233ab4);
  updateWheelTransform(in_stack_00000058,in_stack_00000054,in_stack_00000053);
  return pbVar2;
}

Assistant:

btWheelInfo&	btRaycastVehicle::addWheel( const btVector3& connectionPointCS, const btVector3& wheelDirectionCS0,const btVector3& wheelAxleCS, btScalar suspensionRestLength, btScalar wheelRadius,const btVehicleTuning& tuning, bool isFrontWheel)
{

	btWheelInfoConstructionInfo ci;

	ci.m_chassisConnectionCS = connectionPointCS;
	ci.m_wheelDirectionCS = wheelDirectionCS0;
	ci.m_wheelAxleCS = wheelAxleCS;
	ci.m_suspensionRestLength = suspensionRestLength;
	ci.m_wheelRadius = wheelRadius;
	ci.m_suspensionStiffness = tuning.m_suspensionStiffness;
	ci.m_wheelsDampingCompression = tuning.m_suspensionCompression;
	ci.m_wheelsDampingRelaxation = tuning.m_suspensionDamping;
	ci.m_frictionSlip = tuning.m_frictionSlip;
	ci.m_bIsFrontWheel = isFrontWheel;
	ci.m_maxSuspensionTravelCm = tuning.m_maxSuspensionTravelCm;
	ci.m_maxSuspensionForce = tuning.m_maxSuspensionForce;

	m_wheelInfo.push_back( btWheelInfo(ci));
	
	btWheelInfo& wheel = m_wheelInfo[getNumWheels()-1];
	
	updateWheelTransformsWS( wheel , false );
	updateWheelTransform(getNumWheels()-1,false);
	return wheel;
}